

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_size_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::compiler::cpp::cpp_unittest::GeneratedMessageTest_OneofSize_Test::
~GeneratedMessageTest_OneofSize_Test(GeneratedMessageTest_OneofSize_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(GeneratedMessageTest, OneofSize) {
  struct MockGenerated : public MockMessageBase {  // 16 bytes
    void* foo;                                     // 8 bytes
    int cached_size;                               // 4 bytes
    PROTOBUF_TSAN_DECLARE_MEMBER;                  // 0-4 bytes
                                                   // + 0-4 bytes padding
    uint32_t oneof_case[1];                        // 4 bytes
  };
  ABSL_CHECK_MESSAGE_SIZE(MockGenerated, 32);
  EXPECT_EQ(sizeof(proto2_unittest::TestOneof), sizeof(MockGenerated));
}